

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_class.h
# Opt level: O0

void dukglue_register_method<false,Dog,int>(duk_context *ctx,type method,char *name)

{
  type *val;
  char *in_RCX;
  duk_c_function method_func;
  char *name_local;
  type method_local;
  duk_context *ctx_local;
  
  dukglue::detail::ProtoManager::push_prototype<Dog>(ctx);
  duk_push_c_function(ctx,dukglue::detail::MethodInfo<false,_Dog,_int>::MethodRuntime::
                          call_native_method,0);
  val = (type *)operator_new(0x10);
  val[1] = (type)name;
  *val = method;
  duk_push_pointer(ctx,val);
  duk_put_prop_string(ctx,-2,anon_var_dwarf_da1a);
  duk_push_c_function(ctx,dukglue::detail::MethodInfo<false,_Dog,_int>::MethodRuntime::
                          finalize_method,1);
  duk_set_finalizer(ctx,-2);
  duk_put_prop_string(ctx,-2,in_RCX);
  duk_pop(ctx);
  return;
}

Assistant:

void dukglue_register_method(duk_context* ctx, typename std::conditional<isConst, RetType(Cls::*)(Ts...) const, RetType(Cls::*)(Ts...)>::type method, const char* name)
{
	using namespace dukglue::detail;
	typedef MethodInfo<isConst, Cls, RetType, Ts...> MethodInfo;

	duk_c_function method_func = MethodInfo::MethodRuntime::call_native_method;

	ProtoManager::push_prototype<Cls>(ctx);

	duk_push_c_function(ctx, method_func, sizeof...(Ts));

	duk_push_pointer(ctx, new typename MethodInfo::MethodHolder{ method });
	duk_put_prop_string(ctx, -2, "\xFF" "method_holder"); // consumes raw method pointer

	// make sure we free the method_holder when this function is removed
	duk_push_c_function(ctx, MethodInfo::MethodRuntime::finalize_method, 1);
	duk_set_finalizer(ctx, -2);

	duk_put_prop_string(ctx, -2, name); // consumes method function

	duk_pop(ctx); // pop prototype
}